

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteStandard<signed_char,signed_char,duckdb::UnaryOperatorWrapper,duckdb::TryAbsOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  byte *pbVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  undefined8 sel_vector;
  VectorBuffer *pVVar7;
  idx_t iVar8;
  OutOfRangeException *this;
  bool bVar9;
  optional_idx dict_size;
  undefined1 local_78 [16];
  ValidityMask local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar3 = result->data;
    pdVar6 = input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<signed_char,signed_char,duckdb::UnaryOperatorWrapper,duckdb::TryAbsOperator>
              ((char *)pdVar6,(char *)pdVar3,count,&input->validity,&result->validity,dataptr,
               adds_nulls);
    return;
  }
  if (VVar1 != DICTIONARY_VECTOR) {
    if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar3 = result->data;
      pbVar4 = input->data;
      puVar5 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      bVar2 = *pbVar4;
      if (bVar2 != 0x80) {
        *pdVar3 = (bVar2 ^ (char)bVar2 >> 7) - ((char)bVar2 >> 7);
        return;
      }
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_78 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Overflow on abs(%d)","")
      ;
      OutOfRangeException::OutOfRangeException<signed_char>(this,(string *)local_78,-0x80);
      __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_01ad6f2d;
  }
  if (errors != CANNOT_ERROR) goto LAB_01ad6f2d;
  DictionaryVector::VerifyDictionary(input);
  pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
  local_78._0_8_ = pVVar7[1].data.allocator.ptr;
  if (((Allocator *)local_78._0_8_ == (Allocator *)0xffffffffffffffff) ||
     (iVar8 = optional_idx::GetIndex((optional_idx *)local_78), count < iVar8 * 2)) {
LAB_01ad7165:
    bVar9 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(input);
    pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->auxiliary);
    bVar9 = *(char *)&pVVar7[1]._vptr_VectorBuffer == '\0';
    if (!bVar9) goto LAB_01ad7165;
    pdVar3 = result->data;
    pdVar6 = pVVar7[1].data.pointer;
    iVar8 = optional_idx::GetIndex((optional_idx *)local_78);
    FlatVector::VerifyFlatVector((Vector *)(pVVar7 + 1));
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<signed_char,signed_char,duckdb::UnaryOperatorWrapper,duckdb::TryAbsOperator>
              ((char *)pdVar6,(char *)pdVar3,iVar8,(ValidityMask *)&pVVar7[1].data.allocated_size,
               &result->validity,dataptr,adds_nulls);
    DictionaryVector::VerifyDictionary(input);
    pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
    iVar8 = optional_idx::GetIndex((optional_idx *)local_78);
    Vector::Dictionary(result,result,iVar8,(SelectionVector *)(pVVar7 + 1),count);
  }
  if (bVar9) {
    return;
  }
LAB_01ad6f2d:
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  sel_vector = local_78._0_8_;
  pdVar3 = result->data;
  FlatVector::VerifyFlatVector(result);
  ExecuteLoop<signed_char,signed_char,duckdb::UnaryOperatorWrapper,duckdb::TryAbsOperator>
            ((char *)local_78._8_8_,(char *)pdVar3,count,(SelectionVector *)sel_vector,
             (ValidityMask *)(local_78 + 0x10),&result->validity,dataptr,adds_nulls);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}